

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageView::mouseMoveEvent(PageView *this,QMouseEvent *e)

{
  int delta_00;
  PageViewPrivate *pPVar1;
  QPoint QVar2;
  QPoint local_2c;
  QPoint local_24;
  int local_1c;
  QMouseEvent *pQStack_18;
  int delta;
  QMouseEvent *e_local;
  PageView *this_local;
  
  pQStack_18 = e;
  e_local = (QMouseEvent *)this;
  pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  if ((pPVar1->leftButtonPressed & 1U) != 0) {
    local_2c = QMouseEvent::pos(pQStack_18);
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    local_24 = operator-(&local_2c,&pPVar1->pos);
    local_1c = QPoint::x(&local_24);
    QVar2 = QMouseEvent::pos(pQStack_18);
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    pPVar1->pos = QVar2;
    if (local_1c < 1) {
      if (local_1c < 0) {
        pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
                 ::operator->(&this->d);
        delta_00 = qAbs<int>(&local_1c);
        PageViewPrivate::movePageLeft(pPVar1,delta_00);
      }
    }
    else {
      pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
               ::operator->(&this->d);
      PageViewPrivate::movePageRight(pPVar1,local_1c);
    }
  }
  QEvent::ignore((QEvent *)pQStack_18);
  return;
}

Assistant:

void
PageView::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftButtonPressed )
	{
		const int delta = ( e->pos() - d->pos ).x();

		d->pos = e->pos();

		if( delta > 0 )
			d->movePageRight( delta );
		else if( delta < 0 )
			d->movePageLeft( qAbs( delta ) );
	}

	e->ignore();
}